

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf.c
# Opt level: O1

wchar_t fl_utf8test(char *src,uint srclen)

{
  undefined8 in_RAX;
  wchar_t wVar1;
  char *p;
  char *end;
  wchar_t len;
  undefined8 uStack_28;
  
  if (srclen == 0) {
    return L'\x01';
  }
  end = src + srclen;
  wVar1 = L'\x01';
  uStack_28 = in_RAX;
  do {
    if (*src < '\0') {
      fl_utf8decode(src,end,(wchar_t *)((long)&uStack_28 + 4));
      if (wVar1 < uStack_28._4_4_) {
        wVar1 = uStack_28._4_4_;
      }
      if (uStack_28._4_4_ < L'\x02') {
        return L'\0';
      }
      src = src + uStack_28._4_4_;
    }
    else {
      src = src + 1;
    }
    if (end <= src) {
      return wVar1;
    }
  } while( true );
}

Assistant:

int fl_utf8test(const char* src, unsigned srclen) {
  int ret = 1;
  const char* p = src;
  const char* e = src+srclen;
  while (p < e) {
    if (*p & 0x80) {
      int len; fl_utf8decode(p,e,&len);
      if (len < 2) return 0;
      if (len > ret) ret = len;
      p += len;
    } else {
      p++;
    }
  }
  return ret;
}